

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::message_sign::test_method(message_sign *this)

{
  bool bVar1;
  readonly_property65 rVar2;
  int iVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  string generated_signature;
  string expected_signature;
  string message;
  array<unsigned_char,_32UL> privkey_bytes;
  check_type cVar6;
  lazy_ostream local_240;
  undefined1 *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined1 local_140 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_138;
  string *local_130;
  undefined **local_128;
  element_type *local_120;
  shared_count sStack_118;
  string **local_110;
  long **local_108;
  lazy_ostream local_100;
  undefined1 *local_f0;
  long ***local_e8;
  char *local_e0;
  char *local_d8;
  assertion_result local_d0;
  string local_b8;
  long *local_98;
  size_t local_90;
  long local_88 [2];
  string local_78;
  uchar local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0x10] = 0xb1;
  local_58[0x11] = 0xf8;
  local_58[0x12] = 0x98;
  local_58[0x13] = '\x06';
  local_58[0x14] = '\v';
  local_58[0x15] = 0x98;
  local_58[0x16] = 'H';
  local_58[0x17] = 0x9f;
  local_58[0x18] = 0xa3;
  local_58[0x19] = '\t';
  local_58[0x1a] = 0x84;
  local_58[0x1b] = 'c';
  local_58[0x1c] = 0xc0;
  local_58[0x1d] = '\x03';
  local_58[0x1e] = '(';
  local_58[0x1f] = 'f';
  local_58[0] = 0xd9;
  local_58[1] = '\x7f';
  local_58[2] = 'Q';
  local_58[3] = '\b';
  local_58[4] = 0xf1;
  local_58[5] = '\x1c';
  local_58[6] = 0xda;
  local_58[7] = 'n';
  local_58[8] = 0xee;
  local_58[9] = 0xba;
  local_58[10] = 0xaa;
  local_58[0xb] = 'B';
  local_58[0xc] = '\x0f';
  local_58[0xd] = 0xef;
  local_58[0xe] = '\a';
  local_58[0xf] = '&';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Trust no one","");
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk="
             ,"");
  local_140[0] = false;
  local_138._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x653;
  file.m_begin = (iterator)&local_150;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_160,msg);
  local_120 = (element_type *)0x0;
  sStack_118.pi_ = (sp_counted_base *)0x0;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0138e790;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = (long ***)0xf51895;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_168 = "";
  pvVar4 = (iterator)0x2;
  pvVar5 = (iterator)0x1;
  local_128._0_1_ =
       (class_property<bool>)
       (class_property<bool>)
       ((_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_138._M_head_impl ==
       (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_128,&local_100,2,1,WARN,_cVar6,(size_t)&local_170,0x653);
  boost::detail::shared_count::~shared_count(&sStack_118);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x656;
  file_00.m_begin = (iterator)&local_180;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190,
             msg_00);
  bVar1 = MessageSign((CKey *)local_140,&local_78,&local_b8);
  local_128._0_1_ = (class_property<bool>)!bVar1;
  local_120 = (element_type *)0x0;
  sStack_118.pi_ = (sp_counted_base *)0x0;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0138b458;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = (long ***)0xf518b8;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_198 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_128,&local_100,1,1,WARN,_cVar6,(size_t)&local_1a0,0x656);
  boost::detail::shared_count::~shared_count(&sStack_118);
  CKey::Set<unsigned_char_const*>((CKey *)local_140,local_58,(uchar *)&local_38,true);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x65b;
  file_01.m_begin = (iterator)&local_1b0;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1c0,
             msg_01);
  local_128._0_1_ =
       (class_property<bool>)(local_138._M_head_impl != (array<unsigned_char,_32UL> *)0x0);
  local_120 = (element_type *)0x0;
  sStack_118.pi_ = (sp_counted_base *)0x0;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0138b458;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = (long ***)0xf518d9;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c8 = "";
  pvVar4 = (iterator)0x2;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_128,&local_100,2,1,WARN,_cVar6,(size_t)&local_1d0,0x65b);
  boost::detail::shared_count::~shared_count(&sStack_118);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x65e;
  file_02.m_begin = (iterator)&local_1e0;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1f0,
             msg_02);
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)MessageSign((CKey *)local_140,&local_78,&local_b8);
  local_128 = (undefined **)
              CONCAT71(local_128._1_7_,
                       rVar2.super_readonly_property<bool>.super_class_property<bool>.value);
  local_120 = (element_type *)0x0;
  sStack_118.pi_ = (sp_counted_base *)0x0;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389e50;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = (long ***)0xf518fa;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f8 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_128,&local_100,1,1,WARN,_cVar6,(size_t)&local_200,0x65e);
  boost::detail::shared_count::~shared_count(&sStack_118);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x660;
  file_03.m_begin = (iterator)&local_210;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_220,
             msg_03);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  if (local_90 == local_b8._M_string_length) {
    if (local_90 == 0) {
      local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar3 = bcmp(local_98,local_b8._M_dataplus._M_p,local_90);
      local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar3 == 0);
    }
  }
  else {
    local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_108 = &local_98;
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_d8 = "";
  local_e8 = &local_108;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388fc8;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_110 = &local_130;
  local_130 = &local_b8;
  local_120 = (element_type *)((ulong)local_120 & 0xffffffffffffff00);
  local_128 = &PTR__lazy_ostream_01388fc8;
  sStack_118.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_240,1,2,REQUIRE,0xf51918,(size_t)&local_e0,0x660,&local_100,
             "generated_signature",(assertion_result *)&local_128);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_138._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_138,
               local_138._M_head_impl);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(message_sign)
{
    const std::array<unsigned char, 32> privkey_bytes = {
        // just some random data
        // derived address from this private key: 15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs
        0xD9, 0x7F, 0x51, 0x08, 0xF1, 0x1C, 0xDA, 0x6E,
        0xEE, 0xBA, 0xAA, 0x42, 0x0F, 0xEF, 0x07, 0x26,
        0xB1, 0xF8, 0x98, 0x06, 0x0B, 0x98, 0x48, 0x9F,
        0xA3, 0x09, 0x84, 0x63, 0xC0, 0x03, 0x28, 0x66
    };

    const std::string message = "Trust no one";

    const std::string expected_signature =
        "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk=";

    CKey privkey;
    std::string generated_signature;

    BOOST_REQUIRE_MESSAGE(!privkey.IsValid(),
        "Confirm the private key is invalid");

    BOOST_CHECK_MESSAGE(!MessageSign(privkey, message, generated_signature),
        "Sign with an invalid private key");

    privkey.Set(privkey_bytes.begin(), privkey_bytes.end(), true);

    BOOST_REQUIRE_MESSAGE(privkey.IsValid(),
        "Confirm the private key is valid");

    BOOST_CHECK_MESSAGE(MessageSign(privkey, message, generated_signature),
        "Sign with a valid private key");

    BOOST_CHECK_EQUAL(expected_signature, generated_signature);
}